

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImDrawDataBuilder::FlattenIntoSingleLayer(ImDrawDataBuilder *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  
  iVar3 = this->Layers[0].Size;
  ImVector<ImDrawList_*>::resize(this->Layers,this->Layers[1].Size + iVar3);
  bVar2 = true;
  while ((bVar2 && (iVar1 = this->Layers[1].Size, iVar1 != 0))) {
    memcpy(this->Layers[0].Data + iVar3,this->Layers[1].Data,(long)iVar1 << 3);
    iVar3 = iVar3 + this->Layers[1].Size;
    bVar2 = false;
    ImVector<ImDrawList_*>::resize(this->Layers + 1,0);
  }
  return;
}

Assistant:

void ImDrawDataBuilder::FlattenIntoSingleLayer()
{
    int n = Layers[0].Size;
    int size = n;
    for (int i = 1; i < IM_ARRAYSIZE(Layers); i++)
        size += Layers[i].Size;
    Layers[0].resize(size);
    for (int layer_n = 1; layer_n < IM_ARRAYSIZE(Layers); layer_n++)
    {
        ImVector<ImDrawList*>& layer = Layers[layer_n];
        if (layer.empty())
            continue;
        memcpy(&Layers[0][n], &layer[0], layer.Size * sizeof(ImDrawList*));
        n += layer.Size;
        layer.resize(0);
    }
}